

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O1

void Timidity::PrintDLS(DLS_Data *data)

{
  DLS_Region *pDVar1;
  DLS_Wave *pDVar2;
  DLS_Instrument *pDVar3;
  DLS_Region *pDVar4;
  RGNHEADER *pRVar5;
  WLOOP *pWVar6;
  CONNECTIONLIST *pCVar7;
  WaveFMT *pWVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  
  puts("DLS Data:");
  printf("cInstruments = %u\n");
  if ((data->instruments != (DLS_Instrument *)0x0) && (data->cInstruments != 0)) {
    uVar10 = 0;
    do {
      pDVar3 = data->instruments;
      printf("Instrument %u:\n");
      if (pDVar3[uVar10].name != (char *)0x0) {
        printf("  Name: %s\n");
      }
      if (pDVar3[uVar10].header != (INSTHEADER *)0x0) {
        printf("  ulBank = 0x%8.8x\n",(ulong)((pDVar3[uVar10].header)->Locale).ulBank);
        printf("  ulInstrument = %u\n",(ulong)((pDVar3[uVar10].header)->Locale).ulInstrument);
        printf("  Regions: %u\n");
        if ((pDVar3[uVar10].header)->cRegions != 0) {
          uVar9 = 0;
          do {
            pDVar4 = pDVar3[uVar10].regions;
            pDVar1 = pDVar4 + uVar9;
            printf("  Region %u:\n");
            pRVar5 = pDVar4[uVar9].header;
            if (pRVar5 != (RGNHEADER *)0x0) {
              printf("    RangeKey = { %hu - %hu }\n",(ulong)(pRVar5->RangeKey).usLow,
                     (ulong)(pRVar5->RangeKey).usHigh);
              printf("    RangeVelocity = { %hu - %hu }\n",
                     (ulong)(pDVar1->header->RangeVelocity).usLow,
                     (ulong)(pDVar1->header->RangeVelocity).usHigh);
              printf("    fusOptions = 0x%4.4hx\n",(ulong)pDVar1->header->fusOptions);
              printf("    usKeyGroup = %hu\n",(ulong)pDVar1->header->usKeyGroup);
            }
            if (pDVar1->wlnk != (WAVELINK *)0x0) {
              printf("    wlnk->fusOptions = 0x%4.4hx\n",(ulong)pDVar1->wlnk->fusOptions);
              printf("    wlnk->usPhaseGroup = %hu\n",(ulong)pDVar1->wlnk->usPhaseGroup);
              printf("    wlnk->ulChannel = %u\n",(ulong)pDVar1->wlnk->ulChannel);
              printf("    wlnk->ulTableIndex = %u\n",(ulong)pDVar1->wlnk->ulTableIndex);
            }
            if (pDVar1->wsmp != (WSMPL *)0x0) {
              printf("    wsmp->usUnityNote = %hu\n",(ulong)pDVar1->wsmp->usUnityNote);
              printf("    wsmp->sFineTune = %hd\n",(ulong)(uint)(int)pDVar1->wsmp->sFineTune);
              printf("    wsmp->lAttenuation = %d\n",(ulong)(uint)pDVar1->wsmp->lAttenuation);
              printf("    wsmp->fulOptions = 0x%8.8x\n",(ulong)pDVar1->wsmp->fulOptions);
              printf("    wsmp->cSampleLoops = %u\n",(ulong)pDVar1->wsmp->cSampleLoops);
              if (pDVar1->wsmp->cSampleLoops != 0) {
                lVar11 = 0xc;
                uVar12 = 0;
                do {
                  pWVar6 = pDVar1->wsmp_loop;
                  printf("    Loop %u:\n",uVar12 & 0xffffffff);
                  printf("      ulStart = %u\n",(ulong)*(uint *)((long)pWVar6 + lVar11 + -4));
                  printf("      ulLength = %u\n",(ulong)*(uint *)((long)&pWVar6->cbSize + lVar11));
                  uVar12 = uVar12 + 1;
                  lVar11 = lVar11 + 0x10;
                } while (uVar12 < pDVar1->wsmp->cSampleLoops);
              }
            }
            pCVar7 = pDVar1->art;
            if ((pCVar7 != (CONNECTIONLIST *)0x0) && (pCVar7->cConnections != 0)) {
              PrintArt("Region",pCVar7,pDVar1->artList);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 < (pDVar3[uVar10].header)->cRegions);
        }
      }
      pCVar7 = pDVar3[uVar10].art;
      if ((pCVar7 != (CONNECTIONLIST *)0x0) && (pCVar7->cConnections != 0)) {
        PrintArt("Instrument",pCVar7,pDVar3[uVar10].artList);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < data->cInstruments);
  }
  if ((data->ptbl != (POOLTABLE *)0x0) && (data->ptbl->cCues != 0)) {
    printf("Cues: ");
    if (data->ptbl->cCues != 0) {
      uVar10 = 0;
      do {
        if (uVar10 != 0) {
          printf(", ");
        }
        printf("%u",(ulong)data->ptblList[uVar10].ulOffset);
        uVar10 = uVar10 + 1;
      } while (uVar10 < data->ptbl->cCues);
    }
    putchar(10);
  }
  if ((data->waveList != (DLS_Wave *)0x0) && (data->ptbl != (POOLTABLE *)0x0)) {
    puts("Waves:");
    if (data->ptbl->cCues != 0) {
      uVar10 = 0;
      do {
        pDVar2 = data->waveList + uVar10;
        pWVar8 = pDVar2->format;
        if (pWVar8 != (WaveFMT *)0x0) {
          printf("  Wave %u: Format: %hu, %hu channels, %u Hz, %hu bits (length = %u)\n",
                 uVar10 & 0xffffffff,(ulong)pWVar8->wFormatTag,(ulong)pWVar8->wChannels,
                 (ulong)pWVar8->dwSamplesPerSec,(ulong)pWVar8->wBitsPerSample,pDVar2->length);
        }
        if (pDVar2->wsmp != (WSMPL *)0x0) {
          printf("    wsmp->usUnityNote = %hu\n",(ulong)pDVar2->wsmp->usUnityNote);
          printf("    wsmp->sFineTune = %hd\n",(ulong)(uint)(int)pDVar2->wsmp->sFineTune);
          printf("    wsmp->lAttenuation = %d\n",(ulong)(uint)pDVar2->wsmp->lAttenuation);
          printf("    wsmp->fulOptions = 0x%8.8x\n",(ulong)pDVar2->wsmp->fulOptions);
          printf("    wsmp->cSampleLoops = %u\n",(ulong)pDVar2->wsmp->cSampleLoops);
          if (pDVar2->wsmp->cSampleLoops != 0) {
            lVar11 = 0xc;
            uVar9 = 0;
            do {
              pWVar6 = pDVar2->wsmp_loop;
              printf("    Loop %u:\n",uVar9 & 0xffffffff);
              printf("      ulStart = %u\n",(ulong)*(uint *)((long)pWVar6 + lVar11 + -4));
              printf("      ulLength = %u\n",(ulong)*(uint *)((long)&pWVar6->cbSize + lVar11));
              uVar9 = uVar9 + 1;
              lVar11 = lVar11 + 0x10;
            } while (uVar9 < pDVar2->wsmp->cSampleLoops);
          }
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < data->ptbl->cCues);
    }
  }
  if (data->name != (char *)0x0) {
    printf("Name: %s\n");
  }
  if (data->artist != (char *)0x0) {
    printf("Artist: %s\n");
  }
  if (data->copyright != (char *)0x0) {
    printf("Copyright: %s\n");
  }
  if (data->comments != (char *)0x0) {
    printf("Comments: %s\n");
    return;
  }
  return;
}

Assistant:

void PrintDLS(DLS_Data *data)
{
	printf("DLS Data:\n");
	printf("cInstruments = %u\n", data->cInstruments); 
	if ( data->instruments ) {
		DWORD i;
		for ( i = 0; i < data->cInstruments; ++i ) {
			PrintInstrument(&data->instruments[i], i);
		}
	}
	if ( data->ptbl && data->ptbl->cCues > 0 ) {
		DWORD i;
		printf("Cues: ");
		for ( i = 0; i < data->ptbl->cCues; ++i ) {
			if ( i > 0 ) {
				printf(", ");
			}
			printf("%u", data->ptblList[i].ulOffset);
		}
		printf("\n");
	}
	if ( data->waveList && data->ptbl ) {
		DWORD i;
		printf("Waves:\n");
		for ( i = 0; i < data->ptbl->cCues; ++i ) {
			PrintWave(&data->waveList[i], i);
		}
	}
	if ( data->name ) {
		printf("Name: %s\n", data->name);
	}
	if ( data->artist ) {
		printf("Artist: %s\n", data->artist);
	}
	if ( data->copyright ) {
		printf("Copyright: %s\n", data->copyright);
	}
	if ( data->comments ) {
		printf("Comments: %s\n", data->comments);
	}
}